

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesr.cc
# Opt level: O2

bool __thiscall GOESRProduct::isComplete(GOESRProduct *this)

{
  bool bVar1;
  SegmentIdentificationHeader sih;
  SegmentIdentificationHeader local_22;
  
  bVar1 = true;
  if (this->segmented_ == true) {
    getHeader<lrit::SegmentIdentificationHeader>(&local_22,this);
    bVar1 = (long)(this->files_).
                  super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->files_).
                  super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4 == (ulong)local_22.maxSegment;
  }
  return bVar1;
}

Assistant:

bool GOESRProduct::isComplete() const {
  if (!isSegmented()) {
    return true;
  }

  auto sih = getHeader<lrit::SegmentIdentificationHeader>();
  return files_.size() == sih.maxSegment;
}